

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

void process_monsters(wchar_t minimum_energy)

{
  bitflag *flags;
  uint32_t *puVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  _Bool _Var5;
  uint8_t uVar6;
  wchar_t idx;
  wchar_t wVar7;
  uint32_t uVar8;
  monster_conflict *mon;
  monster_lore *lore;
  int iVar9;
  wchar_t wVar10;
  char local_88 [88];
  
  iVar9 = turn % 100;
  idx = cave_monster_max(cave);
  while (((L'\x01' < idx && (player->is_dead == false)) && (player->upkeep->generate_level == false)
         )) {
    idx = idx + L'\xffffffff';
    mon = (monster_conflict *)cave_monster(cave,idx);
    if (mon->race != (monster_race *)0x0) {
      flags = mon->mflag;
      _Var5 = flag_has_dbg(flags,2,9,"mon->mflag","MFLAG_HANDLED");
      if ((!_Var5) && (bVar2 = mon->energy, minimum_energy <= (int)(uint)bVar2)) {
        uVar3 = z_info->move_energy;
        flag_on_dbg(flags,2,9,"mon->mflag","MFLAG_HANDLED");
        if (iVar9 == 0) {
          regen_monster((monster *)mon,L'\x01');
        }
        wVar10 = (uint)mon->mspeed + L'\n';
        if (mon->m_timed[5] == 0) {
          wVar10 = (uint)mon->mspeed;
        }
        if (mon->m_timed[4] != 0) {
          wVar7 = monster_effect_level((monster *)mon,L'\x04');
          wVar10 = wVar10 + wVar7 * -2;
        }
        wVar10 = turn_energy(wVar10);
        uVar6 = (char)wVar10 + mon->energy;
        mon->energy = uVar6;
        if (uVar3 <= bVar2) {
          mon->energy = uVar6 - (char)z_info->move_energy;
          _Var5 = monster_is_mimicking((monster *)mon);
          if (!_Var5) {
            if ((((int)(uint)mon->cdis <= mon->race->hearing) &&
                (_Var5 = monster_passes_walls((monster *)mon), _Var5)) ||
               ((mon->hp < mon->maxhp ||
                ((((_Var5 = square_isview(cave,mon->grid), _Var5 ||
                   (_Var5 = monster_can_hear((monster *)mon), _Var5)) ||
                  (_Var5 = monster_can_smell((monster *)mon), _Var5)) ||
                 (_Var5 = monster_taking_terrain_damage((chunk *)cave,mon), _Var5)))))) {
              flag_on_dbg(flags,2,2,"mon->mflag","MFLAG_ACTIVE");
            }
            else {
              flag_off(flags,2,2);
            }
            _Var5 = flag_has_dbg(flags,2,2,"mon->mflag","MFLAG_ACTIVE");
            if (_Var5) {
              if (mon->m_timed[0] == 0) {
                uVar8 = Rand_div(10);
                if ((uVar8 == 0) &&
                   (_Var5 = flag_has_dbg(flags,2,2,"mon->mflag","MFLAG_ACTIVE"), _Var5)) {
                  flag_on_dbg(flags,2,8,"mon->mflag","MFLAG_AWARE");
                }
                if (mon->m_timed[5] != 0) {
                  mon_dec_timed((monster *)mon,L'\x05',L'\x01',L'\0');
                }
                if (mon->m_timed[4] != 0) {
                  mon_dec_timed((monster *)mon,L'\x04',L'\x01',L'\0');
                }
                if (mon->m_timed[6] != 0) {
                  mon_dec_timed((monster *)mon,L'\x06',L'\x01',L'\0');
                }
                if (mon->m_timed[7] != 0) {
                  mon_dec_timed((monster *)mon,L'\a',L'\x01',L'\0');
                }
                if (mon->m_timed[1] != 0) {
                  mon_dec_timed((monster *)mon,L'\x01',L'\x01',L'\x01');
                }
                if (mon->m_timed[2] != 0) {
                  mon_dec_timed((monster *)mon,L'\x02',L'\x01',L'\x01');
                }
                if (mon->m_timed[9] != 0) {
                  mon_dec_timed((monster *)mon,L'\t',L'\x01',L'\x01');
                }
                if (mon->m_timed[3] != 0) {
                  uVar8 = Rand_div(mon->race->level / 10 + 1);
                  mon_dec_timed((monster *)mon,L'\x03',uVar8 + L'\x01',L'\x01');
                }
                if (((mon->m_timed[6] == 0) && (mon->m_timed[8] == 0)) &&
                   ((mon->m_timed[1] == 0 || (uVar8 = Rand_div(10), uVar8 != 0)))) {
                  cave->mon_current = idx;
                  monster_turn((monster *)mon);
                  monster_take_terrain_damage(mon);
                  cave->mon_current = L'\xffffffff';
                }
              }
              else {
                wVar10 = (player->state).skills[5];
                uVar8 = Rand_div(0x400);
                lore = get_lore(mon->race);
                _Var5 = player_of_has(player,L'\x1e');
                if ((!_Var5) ||
                   (_Var5 = flag_has_dbg((player->state).pflags,10,0x12,"player->state.pflags",
                                         "(PF_SHADOW)"), _Var5)) {
                  if (uVar8 * uVar8 * uVar8 <= (uint)(1 << (0x1eU - (char)wVar10 & 0x1f))) {
                    uVar3 = (cave->noise).grids[(mon->grid).y][(mon->grid).x];
                    wVar10 = L'\x01';
                    if ((ushort)(uVar3 - 1) < 0x31) {
                      wVar10 = (wchar_t)(byte)(100 / (uVar3 & 0xff));
                    }
                    sVar4 = mon->m_timed[0];
                    mon_dec_timed((monster *)mon,L'\0',wVar10,L'\x01');
                    _Var5 = monster_is_obvious((monster *)mon);
                    if (_Var5) {
                      if (wVar10 < sVar4) {
                        if (lore->ignore != 0xff) {
                          lore->ignore = lore->ignore + '\x01';
                        }
                      }
                      else if (lore->wake != 0xff) {
                        lore->wake = lore->wake + '\x01';
                      }
                      lore_update(mon->race,lore);
                    }
                  }
                }
                else {
                  monster_wake(mon,false,L'd');
                  monster_desc(local_88,0x50,(monster *)mon,L'̄');
                  _Var5 = monster_is_obvious((monster *)mon);
                  if (_Var5) {
                    msg("%s wakes up.",local_88);
                    equip_learn_flag(player,L'\x1e');
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  puVar1 = &player->upkeep->update;
  *puVar1 = *puVar1 | 0x80;
  return;
}

Assistant:

void process_monsters(int minimum_energy)
{
	int i;
	int mspeed;

	/* Only process some things every so often */
	bool regen = false;

	/* Regenerate hitpoints and mana every 100 game turns */
	if (turn % 100 == 0)
		regen = true;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		struct monster *mon;
		bool moving;

		/* Handle "leaving" */
		if (player->is_dead || player->upkeep->generate_level) break;

		/* Get a 'live' monster */
		mon = cave_monster(cave, i);
		if (!mon->race) continue;

		/* Ignore monsters that have already been handled */
		if (mflag_has(mon->mflag, MFLAG_HANDLED))
			continue;

		/* Not enough energy to move yet */
		if (mon->energy < minimum_energy) continue;

		/* Does this monster have enough energy to move? */
		moving = mon->energy >= z_info->move_energy ? true : false;

		/* Prevent reprocessing */
		mflag_on(mon->mflag, MFLAG_HANDLED);

		/* Handle monster regeneration if requested */
		if (regen)
			regen_monster(mon, 1);

		/* Calculate the net speed */
		mspeed = mon->mspeed;
		if (mon->m_timed[MON_TMD_FAST])
			mspeed += 10;
		if (mon->m_timed[MON_TMD_SLOW]) {
			int slow_level = monster_effect_level(mon, MON_TMD_SLOW);
			mspeed -= (2 * slow_level);
		}

		/* Give this monster some energy */
		mon->energy += turn_energy(mspeed);

		/* End the turn of monsters without enough energy to move */
		if (!moving)
			continue;

		/* Use up "some" energy */
		mon->energy -= z_info->move_energy;

		/* Mimics lie in wait */
		if (monster_is_mimicking(mon)) continue;

		/* Check if the monster is active */
		if (monster_check_active(mon)) {
			/* Process timed effects - skip turn if necessary */
			if (process_monster_timed(mon))
				continue;

			/* Set this monster to be the current actor */
			cave->mon_current = i;

			/* The monster takes its turn */
			monster_turn(mon);

			/*
			 * For symmetry with the player, monster can take
			 * terrain damage after its turn.
			 */
			monster_take_terrain_damage(mon);

			/* Monster is no longer current */
			cave->mon_current = -1;
		}
	}

	/* Update monster visibility after this */
	/* XXX This may not be necessary */
	player->upkeep->update |= PU_MONSTERS;
}